

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void llb_buildsystem_destroy(llb_buildsystem_t *system)

{
  llb_buildsystem_t *system_local;
  
  if (system != (llb_buildsystem_t *)0x0) {
    anon_unknown.dwarf_1b8a13::CAPIBuildSystem::~CAPIBuildSystem((CAPIBuildSystem *)system);
    operator_delete(system,0x1f8);
  }
  return;
}

Assistant:

void llb_buildsystem_destroy(llb_buildsystem_t* system) {
  delete (CAPIBuildSystem*)system;
}